

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::ProcessHeadersMessage
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,bool via_compact_block)

{
  uint uVar1;
  long lVar2;
  pointer pCVar3;
  NodeId NVar4;
  base_blob<256U> *pbVar5;
  pointer ppCVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  CBlockIndex *pCVar10;
  CBlockIndex *pCVar11;
  CBlockIndex *pCVar12;
  Chainstate *pCVar13;
  HeadersSyncState *pHVar14;
  CNodeState *pCVar15;
  int64_t iVar16;
  base_uint<256U> *pbVar17;
  string *message;
  string *message_00;
  Level LVar18;
  arith_uint256 *b;
  char *nodeid;
  ChainstateManager *pCVar20;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *__range1;
  pointer ppCVar21;
  CBlockHeader *header;
  pointer pCVar22;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  span<const_CBlockHeader,_18446744073709551615UL> headers_00;
  span<const_CBlockHeader,_18446744073709551615UL> headers_01;
  CBlockIndex *pindexLast;
  NodeId local_120;
  vector<CInv,_std::allocator<CInv>_> vGetData;
  CBlockIndex *local_100;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToFetch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  BlockValidationState state;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined4 local_60;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock64;
  CNode *pCVar19;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar22 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = ((long)pCVar22 - (long)pCVar3) / 0x50;
  if (pCVar22 == pCVar3) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&state,&peer->m_headers_sync_mutex,
               "peer.m_headers_sync_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xbf7,false);
    if ((peer->m_headers_sync)._M_t.
        super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
        super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
        super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl != (HeadersSyncState *)0x0) {
      std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 &peer->m_headers_sync,(pointer)0x0);
      UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                (&criticalblock68,&this->m_headers_presync_mutex,"m_headers_presync_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                 ,0xbfa,false);
      criticalblock64.super_unique_lock._M_device = (mutex_type *)pfrom->id;
      std::
      _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::erase(&(this->m_headers_presync_stats)._M_t,(key_type_conflict *)&criticalblock64);
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock68.super_unique_lock);
    }
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
    goto LAB_001b2d0f;
  }
  bVar7 = HasValidProofOfWork(headers,&this->m_chainparams->consensus);
  if (!bVar7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&state,"header with invalid proof of work",
               (allocator<char> *)&criticalblock68);
    Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message);
LAB_001b2d02:
    std::__cxx11::string::~string((string *)&state);
    goto LAB_001b2d0f;
  }
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       0;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)0x0
  ;
  pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar22 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_start; pCVar22 != pCVar3; pCVar22 = pCVar22 + 1) {
    bVar7 = base_blob<256U>::IsNull((base_blob<256U> *)&state);
    if (!bVar7) {
      bVar7 = operator!=(&(pCVar22->hashPrevBlock).super_base_blob<256U>,(base_blob<256U> *)&state);
      if (bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&state,"non-continuous headers sequence",
                   (allocator<char> *)&criticalblock68);
        Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message_00);
        goto LAB_001b2d02;
      }
    }
    CBlockHeader::GetHash((uint256 *)&criticalblock68,pCVar22);
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         criticalblock68.super_unique_lock._M_device;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)criticalblock68.super_unique_lock._8_8_;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         local_70._M_allocated_capacity;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = local_70._8_8_;
  }
  pindexLast = (CBlockIndex *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&state,&peer->m_headers_sync_mutex,
             "peer.m_headers_sync_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xc1b,false);
  bVar7 = IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
  pCVar22 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar14 = (peer->m_headers_sync)._M_t.
            super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
            super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
            super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
  if (pCVar22 == pCVar3) goto LAB_001b2d0f;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xc31,false);
  pCVar10 = ::node::BlockManager::LookupBlockIndex
                      (&this->m_chainman->m_blockman,
                       &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                         _M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  if (pCVar10 == (CBlockIndex *)0x0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xabe,false);
    pCVar10 = this->m_chainman->m_best_header;
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&state);
    GetLocator((CBlockLocator *)&state,pCVar10);
    pCVar19 = pfrom;
    bVar7 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&state,peer);
    LVar18 = (Level)pCVar19;
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              ((_Vector_base<uint256,_std::allocator<uint256>_> *)&state);
    if (bVar7) {
      bVar7 = ::LogAcceptCategory(NET,LVar18);
      if (bVar7) {
        CBlockHeader::GetHash
                  ((uint256 *)&criticalblock68,
                   (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_start);
        base_blob<256u>::ToString_abi_cxx11_((string *)&state,(base_blob<256u> *)&criticalblock68);
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&criticalblock64,
                   (base_blob<256u> *)
                   &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                     _M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pfrom->id;
        logging_function._M_str = "HandleUnconnectingHeaders";
        logging_function._M_len = 0x19;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x62;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,long>
                  (logging_function,source_file,0xac4,NET,Debug,(ConstevalFormatString<4U>)0x68b90a,
                   (string *)&state,(string *)&criticalblock64,&pCVar10->nHeight,(long *)&vToFetch);
        std::__cxx11::string::~string((string *)&criticalblock64);
        std::__cxx11::string::~string((string *)&state);
      }
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock68,&cs_main,
               "cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xaca,false);
    NVar4 = pfrom->id;
    CBlockHeader::GetHash
              ((uint256 *)&state,
               (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1);
    UpdateBlockAvailability(this,NVar4,(uint256 *)&state);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock68);
    goto LAB_001b2d0f;
  }
  (peer->m_last_getheaders_timestamp).__d.__r = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock68,&cs_main,
             "cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xc47,false);
  pCVar20 = this->m_chainman;
  CBlockHeader::GetHash
            ((uint256 *)&state,
             (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish + -1);
  pCVar11 = ::node::BlockManager::LookupBlockIndex(&pCVar20->m_blockman,(uint256 *)&state);
  if (pCVar11 == (CBlockIndex *)0x0) {
    bVar8 = false;
  }
  else {
    pCVar20 = this->m_chainman;
    if (pCVar20->m_best_header != (CBlockIndex *)0x0) {
      pCVar12 = CBlockIndex::GetAncestor(pCVar20->m_best_header,pCVar11->nHeight);
      if (pCVar12 == pCVar11) {
        bVar8 = true;
        goto LAB_001b2ee3;
      }
      pCVar20 = this->m_chainman;
    }
    pCVar13 = ChainstateManager::ActiveChainstate(pCVar20);
    bVar8 = CChain::Contains(&pCVar13->m_chain,pCVar11);
  }
LAB_001b2ee3:
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&criticalblock68);
  if ((!bVar7 && bVar8 == false) && ((pfrom->m_permission_flags & NoBan) != NoBan)) {
    pCVar22 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start;
    headers_00._M_extent._M_extent_value =
         ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar22) / 0x50;
    headers_00._M_ptr = pCVar22;
    CalculateClaimedHeadersWork((arith_uint256 *)&criticalblock64,headers_00);
    ::operator+((base_uint<256U> *)&criticalblock68,&(pCVar10->nChainWork).super_base_uint<256U>,
                (base_uint<256U> *)&criticalblock64);
    base_uint<256U>::base_uint((base_uint<256U> *)&state,(base_uint<256U> *)&criticalblock68);
    pbVar17 = (base_uint<256U> *)&criticalblock68;
    GetAntiDoSWorkThreshold((arith_uint256 *)pbVar17,this);
    bVar7 = ::operator<((base_uint<256U> *)&state,pbVar17);
    if (bVar7) {
      if (((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x50 == (ulong)(this->m_opts).max_headers_result
         ) {
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  (&criticalblock64,&peer->m_headers_sync_mutex,"peer.m_headers_sync_mutex",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                   ,0xb44,false);
        pHVar14 = (HeadersSyncState *)operator_new(0x1e8);
        HeadersSyncState::HeadersSyncState
                  (pHVar14,peer->m_id,&this->m_chainparams->consensus,pCVar10,
                   (arith_uint256 *)&criticalblock68);
        std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                  ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                   &peer->m_headers_sync,pHVar14);
        IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock64.super_unique_lock);
      }
      else {
        bVar7 = ::LogAcceptCategory(NET,(Level)pbVar17);
        if (bVar7) {
          criticalblock64.super_unique_lock._M_device =
               (mutex_type *)
               (((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x50 + (long)pCVar10->nHeight);
          vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)pfrom->id;
          logging_function_03._M_str = "TryLowWorkHeadersSync";
          logging_function_03._M_len = 0x15;
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_03._M_len = 0x62;
          LogPrintFormatInternal<unsigned_long,long>
                    (logging_function_03,source_file_03,0xb4d,NET,Debug,
                     (ConstevalFormatString<2U>)0x68b975,(unsigned_long *)&criticalblock64,
                     (long *)&vToFetch);
        }
      }
      std::vector<CBlockHeader,std::allocator<CBlockHeader>>::_M_assign_aux<CBlockHeader_const*>
                ((vector<CBlockHeader,std::allocator<CBlockHeader>> *)headers,0,0);
      goto LAB_001b2d0f;
    }
  }
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  pCVar22 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_start;
  headers_01._M_extent._M_extent_value =
       ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pCVar22) / 0x50;
  headers_01._M_ptr = pCVar22;
  bVar7 = ChainstateManager::ProcessNewBlockHeaders
                    (this->m_chainman,headers_01,true,&state,&pindexLast);
  if (bVar7 || state.super_ValidationState<BlockValidationResult>.m_mode != M_INVALID) {
    if (pindexLast == (CBlockIndex *)0x0) {
      __assert_fail("pindexLast",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                    ,0xc6f,
                    "void (anonymous namespace)::PeerManagerImpl::ProcessHeadersMessage(CNode &, Peer &, std::vector<CBlockHeader> &&, bool)"
                   );
    }
    if ((pHVar14 == (HeadersSyncState *)0x0) && (uVar9 == (this->m_opts).max_headers_result)) {
      GetLocator((CBlockLocator *)&criticalblock68,pindexLast);
      pCVar19 = pfrom;
      bVar7 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&criticalblock68,peer);
      LVar18 = (Level)pCVar19;
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)&criticalblock68);
      if (bVar7) {
        bVar7 = ::LogAcceptCategory(NET,LVar18);
        if (bVar7) {
          criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
          logging_function_00._M_str = "ProcessHeadersMessage";
          logging_function_00._M_len = 0x15;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_00._M_len = 0x62;
          LogPrintFormatInternal<int,long,std::atomic<int>>
                    (logging_function_00,source_file_00,0xc76,NET,Debug,
                     (ConstevalFormatString<3U>)0x68b82c,&pindexLast->nHeight,
                     (long *)&criticalblock68,&peer->m_starting_height);
        }
      }
    }
    pCVar10 = pindexLast;
    uVar1 = (this->m_opts).max_headers_result;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&criticalblock64,&cs_main,
               "cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xbbc,false);
    NVar4 = pfrom->id;
    pCVar15 = State(this,NVar4);
    CBlockIndex::GetBlockHash((uint256 *)&criticalblock68,pCVar10);
    UpdateBlockAvailability(this,NVar4,(uint256 *)&criticalblock68);
    if (pCVar11 == (CBlockIndex *)0x0) {
      pCVar13 = ChainstateManager::ActiveChainstate(this->m_chainman);
      bVar7 = operator>(&(pCVar10->nChainWork).super_base_uint<256U>,
                        &((pCVar13->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>);
      if (bVar7) {
        iVar16 = GetTime();
        pCVar15->m_last_block_announcement = iVar16;
      }
    }
    bVar7 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
    if ((bVar7 && uVar9 != uVar1) &&
       (pCVar10 = pCVar15->pindexBestKnownBlock, pCVar10 != (CBlockIndex *)0x0)) {
      pbVar17 = &ChainstateManager::MinimumChainWork(this->m_chainman)->super_base_uint<256U>;
      bVar7 = ::operator<(&(pCVar10->nChainWork).super_base_uint<256U>,pbVar17);
      if (bVar7) {
        bVar7 = CNode::IsOutboundOrBlockRelayConn(pfrom);
        if (bVar7) {
          criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
          logging_function_01._M_str = "UpdatePeerStateForReceivedHeaders";
          logging_function_01._M_len = 0x21;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_01._M_len = 0x62;
          LogPrintFormatInternal<long>
                    (logging_function_01,source_file_01,0xbd8,ALL,Info,
                     (ConstevalFormatString<1U>)0x68b9c9,(long *)&criticalblock68);
          LOCK();
          (pfrom->fDisconnect)._M_base._M_i = true;
          UNLOCK();
        }
      }
    }
    if ((((((pfrom->fDisconnect)._M_base._M_i & 1U) == 0) &&
         (pfrom->m_conn_type == OUTBOUND_FULL_RELAY)) &&
        (pCVar10 = pCVar15->pindexBestKnownBlock, pCVar10 != (CBlockIndex *)0x0)) &&
       (this->m_outbound_peers_with_protect_from_disconnect < 4)) {
      pCVar13 = ChainstateManager::ActiveChainstate(this->m_chainman);
      b = &(pCVar13->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->nChainWork;
      bVar7 = operator>=(&(pCVar10->nChainWork).super_base_uint<256U>,&b->super_base_uint<256U>);
      if ((bVar7) && ((pCVar15->m_chain_sync).m_protect == false)) {
        bVar7 = ::LogAcceptCategory(NET,(Level)b);
        if (bVar7) {
          criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
          logging_function_02._M_str = "UpdatePeerStateForReceivedHeaders";
          logging_function_02._M_len = 0x21;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_02._M_len = 0x62;
          LogPrintFormatInternal<long>
                    (logging_function_02,source_file_02,0xbe5,NET,Debug,
                     (ConstevalFormatString<1U>)0x68ba10,(long *)&criticalblock68);
        }
        (pCVar15->m_chain_sync).m_protect = true;
        this->m_outbound_peers_with_protect_from_disconnect =
             this->m_outbound_peers_with_protect_from_disconnect + 1;
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock64);
    pCVar10 = pindexLast;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock65,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
               ,0xb7a,false);
    pCVar15 = State(this,pfrom->id);
    bVar7 = CanDirectFetch(this);
    if ((bVar7) && ((pCVar10->nStatus & 6) != 0 && (pCVar10->nStatus & 0x60) == 0)) {
      pCVar13 = ChainstateManager::ActiveChainstate(this->m_chainman);
      bVar7 = operator<=(&((pCVar13->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>
                         ,&(pCVar10->nChainWork).super_base_uint<256U>);
      if (bVar7) {
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vToFetch.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (local_100 = pCVar10; local_100 != (CBlockIndex *)0x0; local_100 = local_100->pprev) {
          pCVar13 = ChainstateManager::ActiveChainstate(this->m_chainman);
          bVar7 = CChain::Contains(&pCVar13->m_chain,local_100);
          if ((bVar7) ||
             (0x80 < (ulong)((long)vToFetch.
                                   super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)vToFetch.
                                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start))) break;
          if ((local_100->nStatus & 8) == 0) {
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock68,local_100);
            bVar7 = IsBlockRequested(this,(uint256 *)&criticalblock68);
            if (!bVar7) {
              bVar7 = DeploymentActiveAt<Consensus::BuriedDeployment>
                                (local_100,this->m_chainman,DEPLOYMENT_SEGWIT);
              if ((!bVar7) || (((peer->m_their_services)._M_i & NODE_WITNESS) != NODE_NONE)) {
                std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::push_back
                          (&vToFetch,&local_100);
              }
            }
          }
        }
        pCVar13 = ChainstateManager::ActiveChainstate(this->m_chainman);
        nodeid = (char *)local_100;
        bVar7 = CChain::Contains(&pCVar13->m_chain,local_100);
        ppCVar6 = vToFetch.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (bVar7) {
          vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          ppCVar21 = vToFetch.
                     super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          while ((ppCVar21 != ppCVar6 &&
                 ((pCVar15->vBlocksInFlight).
                  super__List_base<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                  ._M_impl._M_node._M_size < 0x10))) {
            pCVar11 = ppCVar21[-1];
            criticalblock64.super_unique_lock._M_device =
                 (mutex_type *)
                 (CONCAT44(criticalblock64.super_unique_lock._M_device._4_4_,
                           ((uint)(peer->m_their_services)._M_i & 8) << 0x1b) | 2);
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock68,pCVar11);
            std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256>
                      ((vector<CInv,std::allocator<CInv>> *)&vGetData,(uint *)&criticalblock64,
                       (uint256 *)&criticalblock68);
            nodeid = (char *)pfrom->id;
            BlockRequested(this,(NodeId)nodeid,pCVar11,(iterator **)0x0);
            bVar7 = ::LogAcceptCategory(NET,(Level)nodeid);
            ppCVar21 = ppCVar21 + -1;
            if (bVar7) {
              CBlockIndex::GetBlockHash((uint256 *)&criticalblock64,pCVar11);
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)&criticalblock68,(base_blob<256u> *)&criticalblock64);
              local_120 = pfrom->id;
              logging_function_04._M_str = "HeadersDirectFetchBlocks";
              logging_function_04._M_len = 0x18;
              nodeid = "HeadersDirectFetchBlocks";
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_04._M_len = 0x62;
              LogPrintFormatInternal<std::__cxx11::string,long>
                        (logging_function_04,source_file_04,0xb9e,NET,Debug,
                         (ConstevalFormatString<2U>)0x68baaf,(string *)&criticalblock68,&local_120);
              std::__cxx11::string::~string((string *)&criticalblock68);
            }
          }
          if (1 < (ulong)(((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x24)) {
            bVar7 = ::LogAcceptCategory(NET,(Level)nodeid);
            if (bVar7) {
              CBlockIndex::GetBlockHash((uint256 *)&criticalblock64,pCVar10);
              base_blob<256u>::ToString_abi_cxx11_
                        ((string *)&criticalblock68,(base_blob<256u> *)&criticalblock64);
              logging_function_06._M_str = "HeadersDirectFetchBlocks";
              logging_function_06._M_len = 0x18;
              source_file_06._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_06._M_len = 0x62;
              LogPrintFormatInternal<std::__cxx11::string,int>
                        (logging_function_06,source_file_06,0xba3,NET,Debug,
                         (ConstevalFormatString<2U>)0x68bad2,(string *)&criticalblock68,
                         &pCVar10->nHeight);
              std::__cxx11::string::~string((string *)&criticalblock68);
            }
          }
          if (vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
              super__Vector_impl_data._M_start) {
            if (((((this->m_opts).ignore_incoming_txs == false) &&
                 ((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_start == 0x24)) &&
                (pCVar15->m_provides_cmpctblocks != false)) &&
               (((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1 &&
                ((pCVar10->pprev->nStatus & 100) == 4)))) {
              CInv::CInv((CInv *)&criticalblock68,4,
                         &(vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                           super__Vector_impl_data._M_start)->hash);
              *(undefined4 *)
               (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                  super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
               0x1c) = local_60;
              *(size_type *)
               (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                  super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
               0xc) = local_70._M_allocated_capacity;
              *(undefined8 *)
               (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                  super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
               0x14) = local_70._8_8_;
              *(mutex_type **)
               vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
               super__Vector_impl_data._M_start = criticalblock68.super_unique_lock._M_device;
              pbVar5 = &((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start)->hash).super_base_blob<256U>;
              (pbVar5->m_data)._M_elems[4] = criticalblock68.super_unique_lock._M_owns;
              (pbVar5->m_data)._M_elems[5] = criticalblock68.super_unique_lock._9_1_;
              (pbVar5->m_data)._M_elems[6] = criticalblock68.super_unique_lock._10_1_;
              (pbVar5->m_data)._M_elems[7] = criticalblock68.super_unique_lock._11_1_;
              (pbVar5->m_data)._M_elems[8] = criticalblock68.super_unique_lock._12_1_;
              (pbVar5->m_data)._M_elems[9] = criticalblock68.super_unique_lock._13_1_;
              (pbVar5->m_data)._M_elems[10] = criticalblock68.super_unique_lock._14_1_;
              (pbVar5->m_data)._M_elems[0xb] = criticalblock68.super_unique_lock._15_1_;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&criticalblock68,"getdata",(allocator<char> *)&criticalblock64);
            (anonymous_namespace)::PeerManagerImpl::
            MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                      ((PeerManagerImpl *)this,pfrom,(string *)&criticalblock68,&vGetData);
            std::__cxx11::string::~string((string *)&criticalblock68);
          }
          std::_Vector_base<CInv,_std::allocator<CInv>_>::~_Vector_base
                    (&vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>);
        }
        else {
          bVar7 = ::LogAcceptCategory(NET,(Level)nodeid);
          if (bVar7) {
            CBlockIndex::GetBlockHash((uint256 *)&criticalblock64,pCVar10);
            base_blob<256u>::ToString_abi_cxx11_
                      ((string *)&criticalblock68,(base_blob<256u> *)&criticalblock64);
            logging_function_05._M_str = "HeadersDirectFetchBlocks";
            logging_function_05._M_len = 0x18;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_05._M_len = 0x62;
            LogPrintFormatInternal<std::__cxx11::string,int>
                      (logging_function_05,source_file_05,0xb91,NET,Debug,
                       (ConstevalFormatString<2U>)0x68ba83,(string *)&criticalblock68,
                       &pCVar10->nHeight);
            std::__cxx11::string::~string((string *)&criticalblock68);
          }
        }
        std::_Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::~_Vector_base
                  (&vToFetch.
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock65.super_unique_lock);
  }
  else {
    NVar4 = pfrom->id;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock68,"invalid header received",
               (allocator<char> *)&criticalblock64);
    MaybePunishNodeForBlock(this,NVar4,&state,via_compact_block,(string *)&criticalblock68);
    std::__cxx11::string::~string((string *)&criticalblock68);
  }
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
LAB_001b2d0f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessHeadersMessage(CNode& pfrom, Peer& peer,
                                            std::vector<CBlockHeader>&& headers,
                                            bool via_compact_block)
{
    size_t nCount = headers.size();

    if (nCount == 0) {
        // Nothing interesting. Stop asking this peers for more headers.
        // If we were in the middle of headers sync, receiving an empty headers
        // message suggests that the peer suddenly has nothing to give us
        // (perhaps it reorged to our chain). Clear download state for this peer.
        LOCK(peer.m_headers_sync_mutex);
        if (peer.m_headers_sync) {
            peer.m_headers_sync.reset(nullptr);
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        }
        // A headers message with no headers cannot be an announcement, so assume
        // it is a response to our last getheaders request, if there is one.
        peer.m_last_getheaders_timestamp = {};
        return;
    }

    // Before we do any processing, make sure these pass basic sanity checks.
    // We'll rely on headers having valid proof-of-work further down, as an
    // anti-DoS criteria (note: this check is required before passing any
    // headers into HeadersSyncState).
    if (!CheckHeadersPoW(headers, m_chainparams.GetConsensus(), peer)) {
        // Misbehaving() calls are handled within CheckHeadersPoW(), so we can
        // just return. (Note that even if a header is announced via compact
        // block, the header itself should be valid, so this type of error can
        // always be punished.)
        return;
    }

    const CBlockIndex *pindexLast = nullptr;

    // We'll set already_validated_work to true if these headers are
    // successfully processed as part of a low-work headers sync in progress
    // (either in PRESYNC or REDOWNLOAD phase).
    // If true, this will mean that any headers returned to us (ie during
    // REDOWNLOAD) can be validated without further anti-DoS checks.
    bool already_validated_work = false;

    // If we're in the middle of headers sync, let it do its magic.
    bool have_headers_sync = false;
    {
        LOCK(peer.m_headers_sync_mutex);

        already_validated_work = IsContinuationOfLowWorkHeadersSync(peer, pfrom, headers);

        // The headers we passed in may have been:
        // - untouched, perhaps if no headers-sync was in progress, or some
        //   failure occurred
        // - erased, such as if the headers were successfully processed and no
        //   additional headers processing needs to take place (such as if we
        //   are still in PRESYNC)
        // - replaced with headers that are now ready for validation, such as
        //   during the REDOWNLOAD phase of a low-work headers sync.
        // So just check whether we still have headers that we need to process,
        // or not.
        if (headers.empty()) {
            return;
        }

        have_headers_sync = !!peer.m_headers_sync;
    }

    // Do these headers connect to something in our block index?
    const CBlockIndex *chain_start_header{WITH_LOCK(::cs_main, return m_chainman.m_blockman.LookupBlockIndex(headers[0].hashPrevBlock))};
    bool headers_connect_blockindex{chain_start_header != nullptr};

    if (!headers_connect_blockindex) {
        // This could be a BIP 130 block announcement, use
        // special logic for handling headers that don't connect, as this
        // could be benign.
        HandleUnconnectingHeaders(pfrom, peer, headers);
        return;
    }

    // If headers connect, assume that this is in response to any outstanding getheaders
    // request we may have sent, and clear out the time of our last request. Non-connecting
    // headers cannot be a response to a getheaders request.
    peer.m_last_getheaders_timestamp = {};

    // If the headers we received are already in memory and an ancestor of
    // m_best_header or our tip, skip anti-DoS checks. These headers will not
    // use any more memory (and we are not leaking information that could be
    // used to fingerprint us).
    const CBlockIndex *last_received_header{nullptr};
    {
        LOCK(cs_main);
        last_received_header = m_chainman.m_blockman.LookupBlockIndex(headers.back().GetHash());
        if (IsAncestorOfBestHeaderOrTip(last_received_header)) {
            already_validated_work = true;
        }
    }

    // If our peer has NetPermissionFlags::NoBan privileges, then bypass our
    // anti-DoS logic (this saves bandwidth when we connect to a trusted peer
    // on startup).
    if (pfrom.HasPermission(NetPermissionFlags::NoBan)) {
        already_validated_work = true;
    }

    // At this point, the headers connect to something in our block index.
    // Do anti-DoS checks to determine if we should process or store for later
    // processing.
    if (!already_validated_work && TryLowWorkHeadersSync(peer, pfrom,
                chain_start_header, headers)) {
        // If we successfully started a low-work headers sync, then there
        // should be no headers to process any further.
        Assume(headers.empty());
        return;
    }

    // At this point, we have a set of headers with sufficient work on them
    // which can be processed.

    // If we don't have the last header, then this peer will have given us
    // something new (if these headers are valid).
    bool received_new_header{last_received_header == nullptr};

    // Now process all the headers.
    BlockValidationState state;
    if (!m_chainman.ProcessNewBlockHeaders(headers, /*min_pow_checked=*/true, state, &pindexLast)) {
        if (state.IsInvalid()) {
            MaybePunishNodeForBlock(pfrom.GetId(), state, via_compact_block, "invalid header received");
            return;
        }
    }
    assert(pindexLast);

    // Consider fetching more headers if we are not using our headers-sync mechanism.
    if (nCount == m_opts.max_headers_result && !have_headers_sync) {
        // Headers message had its maximum size; the peer may have more headers.
        if (MaybeSendGetHeaders(pfrom, GetLocator(pindexLast), peer)) {
            LogDebug(BCLog::NET, "more getheaders (%d) to end to peer=%d (startheight:%d)\n",
                    pindexLast->nHeight, pfrom.GetId(), peer.m_starting_height);
        }
    }

    UpdatePeerStateForReceivedHeaders(pfrom, peer, *pindexLast, received_new_header, nCount == m_opts.max_headers_result);

    // Consider immediately downloading blocks.
    HeadersDirectFetchBlocks(pfrom, peer, *pindexLast);

    return;
}